

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Buffer::Free(Buffer *this,int BlockNum)

{
  bool bVar1;
  reference piVar2;
  const_iterator local_40;
  _List_node_base *local_38;
  _Self local_30;
  _List_node_base *local_28;
  _List_iterator<int> local_20;
  iterator it;
  int pos;
  int BlockNum_local;
  Buffer *this_local;
  
  it._M_node._4_4_ = BlockNum;
  std::_List_iterator<int>::_List_iterator(&local_20);
  local_28 = (_List_node_base *)Find(this,it._M_node._4_4_);
  local_20._M_node = local_28;
  local_30._M_node =
       (_List_node_base *)std::__cxx11::list<int,_std::allocator<int>_>::end(&this->Occupy_Block);
  bVar1 = std::operator!=(&local_20,&local_30);
  if (bVar1) {
    piVar2 = std::_List_iterator<int>::operator*(&local_20);
    it._M_node._0_4_ = *piVar2;
    std::_List_const_iterator<int>::_List_const_iterator(&local_40,&local_20);
    local_38 = (_List_node_base *)
               std::__cxx11::list<int,_std::allocator<int>_>::erase(&this->Occupy_Block,local_40);
    local_20._M_node = local_38;
    std::__cxx11::list<int,_std::allocator<int>_>::push_back
              (&this->Empty_Block,(value_type_conflict *)&it);
    Block::BlockClear_Back(this->buffer + (int)it._M_node);
    UnDirt(this,(int)it._M_node);
    UnLock(this,(int)it._M_node);
  }
  return;
}

Assistant:

void Buffer::Free(int BlockNum) {
	int pos;
	list<int>::iterator it;
	it = this->Find(BlockNum);
	if (it != this->Occupy_Block.end()) {			//B�ڱ�ռ��������
		pos = *it;
		it = this->Occupy_Block.erase(it);			//��ռ�ÿ�������ɾȥ
		this->Empty_Block.push_back(pos);			//��ӽ��տ�������
		this->buffer[pos].BlockClear_Back();
		this->UnDirt(pos);
		this->UnLock(pos);
	}
}